

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

bool __thiscall QTreeView::isFirstColumnSpanned(QTreeView *this,int row,QModelIndex *parent)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  QTreeViewPrivate *pQVar3;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  QTreeViewPrivate *d;
  QModelIndex index;
  QPersistentModelIndex *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  bool local_29;
  QPersistentModelIndex local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QTreeView *)0x8efdde);
  bVar2 = QSet<QPersistentModelIndex>::isEmpty((QSet<QPersistentModelIndex> *)0x8efdf4);
  if ((bVar2) || ((pQVar3->super_QAbstractItemViewPrivate).model == (QAbstractItemModel *)0x0)) {
    local_29 = false;
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (pQVar3->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_20,pQVar1,in_ESI,0,in_RDX);
    QPersistentModelIndex::QPersistentModelIndex(&local_28,(QModelIndex *)&local_20);
    local_29 = QSet<QPersistentModelIndex>::contains
                         ((QSet<QPersistentModelIndex> *)
                          CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98);
    QPersistentModelIndex::~QPersistentModelIndex(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeView::isFirstColumnSpanned(int row, const QModelIndex &parent) const
{
    Q_D(const QTreeView);
    if (d->spanningIndexes.isEmpty() || !d->model)
        return false;
    const QModelIndex index = d->model->index(row, 0, parent);
    return d->spanningIndexes.contains(index);
}